

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  Curl_easy *pCVar1;
  byte *__s;
  long lVar2;
  bool bVar3;
  curl_socket_t __fd;
  _Bool _Var4;
  ushort uVar5;
  CURLcode CVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  if2ip_result_t iVar10;
  size_t sVar11;
  int *piVar12;
  uint *puVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  socklen_t __len;
  uint uVar17;
  Curl_easy *pCVar18;
  char *__nptr;
  curltime cVar19;
  long lStack_2e0;
  curl_socket_t sockfd;
  byte *local_2c8;
  uint local_2bc;
  Curl_easy *local_2b8;
  uint *local_2b0;
  Curl_dns_entry *h;
  uint local_29c;
  Curl_easy *local_298;
  int optval;
  socklen_t local_28c;
  Curl_sockaddr_storage sa;
  long port;
  Curl_sockaddr_ex addr;
  char ipaddress [46];
  char myhost [256];
  
  pCVar18 = conn->data;
  optval = 1;
  *sockp = -1;
  CVar6 = Curl_socket(conn,ai,&addr,&sockfd);
  if (CVar6 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var4 = Curl_getaddressinfo(&addr._sa_ex_u.addr,ipaddress,&port);
  if (!_Var4) {
    puVar13 = (uint *)__errno_location();
    uVar17 = *puVar13;
    pcVar16 = Curl_strerror(conn,uVar17);
    Curl_failf(pCVar18,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar17,pcVar16);
    Curl_closesocket(conn,sockfd);
    return CURLE_OK;
  }
  Curl_infof(pCVar18,"  Trying %s...\n",ipaddress);
  if (((addr.family & 0xfffffff7U) == 2) && (addr.socktype == 1)) {
    if ((pCVar18->set).tcp_nodelay == true) {
      Curl_tcpnodelay(conn,sockfd);
    }
    __fd = sockfd;
    if ((pCVar18->set).tcp_keepalive == true) {
      uVar15 = (ulong)(uint)sockfd;
      myhost[0] = '\x01';
      myhost[1] = '\0';
      myhost[2] = '\0';
      myhost[3] = '\0';
      iVar7 = setsockopt(sockfd,1,9,myhost,4);
      if (iVar7 < 0) {
        pcVar16 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar7 = curlx_sltosi((pCVar18->set).tcp_keepidle);
        myhost[0] = (char)iVar7;
        myhost[1] = (char)((uint)iVar7 >> 8);
        myhost[2] = (char)((uint)iVar7 >> 0x10);
        myhost[3] = (char)((uint)iVar7 >> 0x18);
        iVar7 = setsockopt(__fd,6,4,myhost,4);
        if (iVar7 < 0) {
          Curl_infof(pCVar18,"Failed to set TCP_KEEPIDLE on fd %d\n",uVar15);
        }
        iVar7 = curlx_sltosi((pCVar18->set).tcp_keepintvl);
        myhost[0] = (char)iVar7;
        myhost[1] = (char)((uint)iVar7 >> 8);
        myhost[2] = (char)((uint)iVar7 >> 0x10);
        myhost[3] = (char)((uint)iVar7 >> 0x18);
        iVar7 = setsockopt(__fd,6,5,myhost,4);
        if (-1 < iVar7) goto LAB_00126be1;
        pcVar16 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pCVar18,pcVar16,uVar15);
    }
  }
LAB_00126be1:
  uVar17 = sockfd;
  if ((pCVar18->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_00126c31:
    bVar3 = false;
  }
  else {
    Curl_set_in_callback(pCVar18,true);
    uVar17 = sockfd;
    iVar7 = (*(pCVar18->set).fsockopt)((pCVar18->set).sockopt_client,sockfd,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(pCVar18,false);
    if (iVar7 == 0) goto LAB_00126c31;
    if (iVar7 != 2) {
      Curl_closesocket(conn,uVar17);
      return CURLE_ABORTED_BY_CALLBACK;
    }
    bVar3 = true;
  }
  if ((addr.family & 0xfffffff7U) != 2) goto LAB_00126d5d;
  local_2bc = addr.family;
  uVar8 = Curl_ipv6_scope(&addr._sa_ex_u.addr);
  pCVar1 = conn->data;
  h = (Curl_dns_entry *)0x0;
  uVar5 = (pCVar1->set).localport;
  uVar15 = (ulong)uVar5;
  __s = (byte *)(pCVar1->set).str[8];
  if (uVar5 == 0 && __s == (byte *)0x0) goto LAB_00126d5d;
  local_2b0 = (uint *)CONCAT44(local_2b0._4_4_,uVar8);
  iVar7 = (pCVar1->set).localportrange;
  sa.buffer._112_8_ = 0;
  sa.buffer.sa_stor.__ss_align = 0;
  sa.buffer._96_8_ = 0;
  sa.buffer._104_8_ = 0;
  sa.buffer._80_8_ = 0;
  sa.buffer._88_8_ = 0;
  sa.buffer._64_8_ = 0;
  sa.buffer._72_8_ = 0;
  sa.buffer._48_8_ = 0;
  sa.buffer._56_8_ = 0;
  sa.buffer._32_8_ = 0;
  sa.buffer._40_8_ = 0;
  sa.buffer._16_8_ = 0;
  sa.buffer._24_8_ = 0;
  sa.buffer._0_8_ = 0;
  sa.buffer._8_1_ = '\0';
  sa.buffer._9_1_ = '\0';
  sa.buffer._10_1_ = '\0';
  sa.buffer._11_1_ = '\0';
  sa.buffer._12_1_ = '\0';
  sa.buffer._13_1_ = '\0';
  sa.buffer._14_1_ = '\0';
  sa.buffer._15_1_ = '\0';
  local_2b8 = pCVar1;
  local_29c = uVar17;
  local_298 = pCVar18;
  if ((__s == (byte *)0x0) || (local_2c8 = __s, sVar11 = strlen((char *)__s), 0xfe < sVar11)) {
    local_2b0 = (uint *)sockp;
    if (local_2bc == 2) {
LAB_001270cc:
      sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
      sa.buffer.sa.sa_family = 2;
      __len = 0x10;
    }
    else {
      __len = 0;
      if (local_2bc == 10) {
        sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
        sa.buffer.sa.sa_family = 10;
        __len = 0x1c;
      }
    }
LAB_001270e3:
    while( true ) {
      iVar14 = bind(local_29c,(sockaddr *)&sa,__len);
      uVar15 = uVar15 & 0xffff;
      if (-1 < iVar14) break;
      if (iVar7 < 2) {
        puVar13 = (uint *)__errno_location();
        pCVar18 = local_2b8;
        uVar17 = *puVar13;
        (local_2b8->state).os_errno = uVar17;
        pcVar16 = Curl_strerror(conn,uVar17);
        Curl_failf(pCVar18,"bind failed with errno %d: %s",(ulong)uVar17,pcVar16);
        iVar10 = 0x2d;
        goto LAB_0012726d;
      }
      iVar7 = iVar7 + -1;
      Curl_infof(local_2b8,"Bind to local port %hu failed, trying next\n",uVar15);
      uVar17 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar17;
      uVar5 = (ushort)uVar17;
      sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
    }
    local_28c = 0x80;
    myhost[0] = '\0';
    myhost[1] = '\0';
    myhost[2] = '\0';
    myhost[3] = '\0';
    myhost[4] = '\0';
    myhost[5] = '\0';
    myhost[6] = '\0';
    myhost[7] = '\0';
    myhost[8] = '\0';
    myhost[9] = '\0';
    myhost[10] = '\0';
    myhost[0xb] = '\0';
    myhost[0xc] = '\0';
    myhost[0xd] = '\0';
    myhost[0xe] = '\0';
    myhost[0xf] = '\0';
    myhost[0x10] = '\0';
    myhost[0x11] = '\0';
    myhost[0x12] = '\0';
    myhost[0x13] = '\0';
    myhost[0x14] = '\0';
    myhost[0x15] = '\0';
    myhost[0x16] = '\0';
    myhost[0x17] = '\0';
    myhost[0x18] = '\0';
    myhost[0x19] = '\0';
    myhost[0x1a] = '\0';
    myhost[0x1b] = '\0';
    myhost[0x1c] = '\0';
    myhost[0x1d] = '\0';
    myhost[0x1e] = '\0';
    myhost[0x1f] = '\0';
    myhost[0x20] = '\0';
    myhost[0x21] = '\0';
    myhost[0x22] = '\0';
    myhost[0x23] = '\0';
    myhost[0x24] = '\0';
    myhost[0x25] = '\0';
    myhost[0x26] = '\0';
    myhost[0x27] = '\0';
    myhost[0x28] = '\0';
    myhost[0x29] = '\0';
    myhost[0x2a] = '\0';
    myhost[0x2b] = '\0';
    myhost[0x2c] = '\0';
    myhost[0x2d] = '\0';
    myhost[0x2e] = '\0';
    myhost[0x2f] = '\0';
    myhost[0x30] = '\0';
    myhost[0x31] = '\0';
    myhost[0x32] = '\0';
    myhost[0x33] = '\0';
    myhost[0x34] = '\0';
    myhost[0x35] = '\0';
    myhost[0x36] = '\0';
    myhost[0x37] = '\0';
    myhost[0x38] = '\0';
    myhost[0x39] = '\0';
    myhost[0x3a] = '\0';
    myhost[0x3b] = '\0';
    myhost[0x3c] = '\0';
    myhost[0x3d] = '\0';
    myhost[0x3e] = '\0';
    myhost[0x3f] = '\0';
    myhost[0x40] = '\0';
    myhost[0x41] = '\0';
    myhost[0x42] = '\0';
    myhost[0x43] = '\0';
    myhost[0x44] = '\0';
    myhost[0x45] = '\0';
    myhost[0x46] = '\0';
    myhost[0x47] = '\0';
    myhost[0x48] = '\0';
    myhost[0x49] = '\0';
    myhost[0x4a] = '\0';
    myhost[0x4b] = '\0';
    myhost[0x4c] = '\0';
    myhost[0x4d] = '\0';
    myhost[0x4e] = '\0';
    myhost[0x4f] = '\0';
    myhost[0x50] = '\0';
    myhost[0x51] = '\0';
    myhost[0x52] = '\0';
    myhost[0x53] = '\0';
    myhost[0x54] = '\0';
    myhost[0x55] = '\0';
    myhost[0x56] = '\0';
    myhost[0x57] = '\0';
    myhost[0x58] = '\0';
    myhost[0x59] = '\0';
    myhost[0x5a] = '\0';
    myhost[0x5b] = '\0';
    myhost[0x5c] = '\0';
    myhost[0x5d] = '\0';
    myhost[0x5e] = '\0';
    myhost[0x5f] = '\0';
    myhost[0x60] = '\0';
    myhost[0x61] = '\0';
    myhost[0x62] = '\0';
    myhost[99] = '\0';
    myhost[100] = '\0';
    myhost[0x65] = '\0';
    myhost[0x66] = '\0';
    myhost[0x67] = '\0';
    myhost[0x68] = '\0';
    myhost[0x69] = '\0';
    myhost[0x6a] = '\0';
    myhost[0x6b] = '\0';
    myhost[0x6c] = '\0';
    myhost[0x6d] = '\0';
    myhost[0x6e] = '\0';
    myhost[0x6f] = '\0';
    myhost[0x70] = '\0';
    myhost[0x71] = '\0';
    myhost[0x72] = '\0';
    myhost[0x73] = '\0';
    myhost[0x74] = '\0';
    myhost[0x75] = '\0';
    myhost[0x76] = '\0';
    myhost[0x77] = '\0';
    myhost[0x78] = '\0';
    myhost[0x79] = '\0';
    myhost[0x7a] = '\0';
    myhost[0x7b] = '\0';
    myhost[0x7c] = '\0';
    myhost[0x7d] = '\0';
    myhost[0x7e] = '\0';
    myhost[0x7f] = '\0';
    iVar7 = getsockname(local_29c,(sockaddr *)myhost,&local_28c);
    if (iVar7 < 0) {
      puVar13 = (uint *)__errno_location();
      pCVar18 = local_2b8;
      uVar17 = *puVar13;
      (local_2b8->state).os_errno = uVar17;
      pcVar16 = Curl_strerror(conn,uVar17);
      Curl_failf(pCVar18,"getsockname() failed with errno %d: %s",(ulong)uVar17,pcVar16);
      iVar10 = 0x2d;
      sockp = (curl_socket_t *)local_2b0;
    }
    else {
      iVar10 = IF2IP_NOT_FOUND;
      Curl_infof(local_2b8,"Local port: %hu\n",uVar15);
      (conn->bits).bound = true;
      sockp = (curl_socket_t *)local_2b0;
    }
  }
  else {
    memset(myhost,0,0x100);
    iVar14 = *local_2c8 - 0x69;
    if ((iVar14 == 0) && (iVar14 = local_2c8[1] - 0x66, iVar14 == 0)) {
      iVar14 = 0x21 - (uint)local_2c8[2];
    }
    else {
      iVar14 = -iVar14;
    }
    if (iVar14 != 0) {
      iVar9 = strncmp("host!",(char *)local_2c8,5);
      if (iVar9 != 0) goto LAB_00126ee3;
      local_2c8 = local_2c8 + 5;
      goto LAB_00126f86;
    }
    local_2c8 = local_2c8 + 3;
LAB_00126ee3:
    sVar11 = strlen((char *)local_2c8);
    iVar9 = setsockopt(uVar17,1,0x19,local_2c8,(int)sVar11 + 1);
    if (iVar9 == 0) {
      iVar10 = IF2IP_NOT_FOUND;
      goto LAB_00127260;
    }
    iVar10 = Curl_if2ip(local_2bc,(uint)local_2b0,conn->scope_id,(char *)local_2c8,myhost,0x100);
    uVar17 = local_2bc;
    if (iVar10 == IF2IP_FOUND) {
      local_2b0 = (uint *)sockp;
      Curl_infof(local_2b8,"Local Interface %s is ip %s using address family %i\n",local_2c8,myhost,
                 (ulong)local_2bc);
LAB_0012707f:
      __len = 0;
      if (uVar17 == 2) {
        iVar14 = inet_pton(2,myhost,(void *)((long)&sa.buffer + 4));
        if (0 < iVar14) goto LAB_001270cc;
      }
      else {
        __len = 0;
        if (uVar17 == 10) {
          pcVar16 = strchr(myhost,0x25);
          if (pcVar16 == (char *)0x0) {
            __nptr = (char *)0x0;
          }
          else {
            __nptr = pcVar16 + 1;
            *pcVar16 = '\0';
          }
          iVar14 = inet_pton(10,myhost,(void *)((long)&sa.buffer + 8));
          __len = 0x1c;
          if (0 < iVar14) {
            sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
            sa.buffer.sa.sa_family = 10;
            if (__nptr != (char *)0x0) {
              iVar14 = atoi(__nptr);
              sa.buffer.sa_in6.sin6_scope_id = iVar14;
            }
          }
        }
      }
      goto LAB_001270e3;
    }
    if (iVar10 != IF2IP_AF_NOT_SUPPORTED) {
      if (iVar10 == IF2IP_NOT_FOUND) {
        if (iVar14 != 0) goto LAB_00126f86;
        Curl_failf(local_2b8,"Couldn\'t bind to interface \'%s\'");
        iVar10 = 0x2d;
      }
      else {
        if (iVar14 != 0) {
LAB_00126f86:
          lVar2 = conn->ip_version;
          if (local_2bc == 2) {
            lStack_2e0 = 1;
LAB_00126fa6:
            conn->ip_version = lStack_2e0;
          }
          else if (local_2bc == 10) {
            lStack_2e0 = 2;
            goto LAB_00126fa6;
          }
          local_2b0 = (uint *)sockp;
          iVar14 = Curl_resolv(conn,(char *)local_2c8,0,&h);
          if (iVar14 == 1) {
            Curl_resolver_wait_resolv(conn,&h);
          }
          conn->ip_version = lVar2;
          sockp = (curl_socket_t *)local_2b0;
          if (h != (Curl_dns_entry *)0x0) {
            Curl_printable_address(h->addr,myhost,0x100);
            pCVar18 = local_2b8;
            uVar17 = local_2bc;
            Curl_infof(local_2b8,"Name \'%s\' family %i resolved to \'%s\' family %i\n",local_2c8,
                       (ulong)local_2bc,myhost,(ulong)(uint)h->addr->ai_family);
            Curl_resolv_unlock(pCVar18,h);
            goto LAB_0012707f;
          }
        }
        (local_2b8->state).errorbuf = false;
        Curl_failf(local_2b8,"Couldn\'t bind to \'%s\'",local_2c8);
        iVar10 = 0x2d;
      }
    }
  }
LAB_00127260:
  pCVar18 = local_298;
  uVar17 = sockfd;
  if (iVar10 != IF2IP_NOT_FOUND) {
LAB_0012726d:
    Curl_closesocket(conn,sockfd);
    if (iVar10 == IF2IP_AF_NOT_SUPPORTED) {
      return CURLE_COULDNT_CONNECT;
    }
    return iVar10;
  }
LAB_00126d5d:
  curlx_nonblock(uVar17,1);
  cVar19 = Curl_now();
  (conn->connecttime).tv_sec = cVar19.tv_sec;
  (conn->connecttime).tv_usec = cVar19.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(pCVar18,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
  }
  if ((!bVar3) && (conn->socktype == 1)) {
    if ((conn->bits).tcp_fastopen == true) {
      iVar7 = setsockopt(uVar17,6,0x1e,&optval,4);
      if (iVar7 < 0) {
        Curl_infof(pCVar18,"Failed to enable TCP Fast Open on fd %d\n",(ulong)uVar17);
      }
      else {
        Curl_infof(pCVar18,"TCP_FASTOPEN_CONNECT set\n");
      }
    }
    iVar7 = connect(uVar17,(sockaddr *)&addr._sa_ex_u.addr,addr.addrlen);
    if (iVar7 == -1) {
      piVar12 = __errno_location();
      iVar7 = *piVar12;
      if ((iVar7 != 0xb) && (iVar7 != 0x73)) {
        pcVar16 = Curl_strerror(conn,iVar7);
        Curl_infof(pCVar18,"Immediate connect fail for %s: %s\n",ipaddress,pcVar16);
        (pCVar18->state).os_errno = iVar7;
        Curl_closesocket(conn,uVar17);
        return CURLE_COULDNT_CONNECT;
      }
    }
  }
  *sockp = uVar17;
  return CURLE_OK;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!Curl_getaddressinfo((struct sockaddr*)&addr.sa_addr,
                          ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(conn, errno));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    Curl_tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d\n", sockfd);
      else
        infof(data, "TCP_FASTOPEN_CONNECT set\n");

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}